

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O1

LOs __thiscall
Omega_h::form_new_conn(Omega_h *this,Dist *new_ents2old_owners,Dist *old_owners2new_uses)

{
  void **ppvVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Dist *other;
  Alloc *pAVar6;
  LO LVar7;
  LO LVar8;
  long lVar9;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar10;
  undefined4 uVar11;
  long lVar12;
  long lVar13;
  LOs LVar14;
  IntIterator last;
  Write<int> serv_uses2new_idxs;
  type f;
  LOs old_owners2serv_ents;
  LOs old_owners2serv_uses;
  Read<int> serv_uses2ranks;
  Read<int> serv_ents2ranks;
  Read<int> serv_ents2new_idxs;
  Dist serv_uses2new_uses;
  Dist old_owners2new_ents;
  Write<int> local_2d8;
  Dist *local_2c8;
  void *local_2c0;
  Alloc *local_2b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b0;
  Alloc *local_2a8;
  void *local_2a0;
  element_type *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  Alloc *local_288;
  void *local_280;
  element_type *local_278;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  element_type *local_268;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  Write<int> local_258;
  Alloc *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  Alloc *local_238;
  void *local_230;
  undefined1 local_228 [24];
  void *local_210;
  undefined1 local_208 [16];
  Alloc *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f0;
  Alloc *local_1e8;
  void *pvStack_1e0;
  element_type *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  Alloc *local_1c8;
  void *pvStack_1c0;
  element_type *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  element_type *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  Read<signed_char> local_188;
  Read<int> local_178;
  undefined1 local_168 [32];
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  Alloc *local_138;
  void *local_130;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  LOs local_d8;
  Dist local_c0;
  
  LVar7 = Dist::nitems(new_ents2old_owners);
  local_c0.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c0.roots2items_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  Read<int>::Read(&local_178,LVar7,0,1,(string *)&local_c0);
  Dist::exch<int>((Dist *)local_208,(Read<int> *)new_ents2old_owners,(Int)&local_178);
  if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_178.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_178.write_.shared_alloc_.alloc);
      operator_delete(local_178.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (local_c0.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_c0.roots2items_) {
    operator_delete(local_c0.parent_comm_.
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)((long)&(local_c0.roots2items_[0].write_.shared_alloc_.alloc)->size + 1))
    ;
  }
  Dist::invert(&local_c0,new_ents2old_owners);
  Dist::items2ranks((Dist *)(local_228 + 0x10));
  Dist::items2ranks((Dist *)local_228);
  LVar7 = Dist::nitems(old_owners2new_uses);
  Dist::roots2items(old_owners2new_uses);
  Dist::roots2items(&local_c0);
  local_2c8 = old_owners2new_uses;
  LVar8 = Dist::nroots(&local_c0);
  local_168._0_8_ = (Alloc *)(local_168 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"");
  Write<int>::Write(&local_2d8,LVar7,(string *)local_168);
  if ((Alloc *)local_168._0_8_ != (Alloc *)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
  }
  local_2b8 = local_248;
  if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2b8 = (Alloc *)(local_248->size * 8 + 1);
    }
    else {
      local_248->use_count = local_248->use_count + 1;
    }
  }
  local_2b0 = local_240;
  local_2a8 = local_238;
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8 = (Alloc *)(local_238->size * 8 + 1);
    }
    else {
      local_238->use_count = local_238->use_count + 1;
    }
  }
  local_2a0 = local_230;
  local_298 = (element_type *)local_228._0_8_;
  if ((local_228._0_8_ & 7) == 0 && (element_type *)local_228._0_8_ != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_298 = (element_type *)((long)*(Library **)local_228._0_8_ * 8 + 1);
    }
    else {
      ppvVar1 = &(((HostRead<int> *)(local_228._0_8_ + 0x28))->read_).write_.shared_alloc_.
                 direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
  local_288 = (Alloc *)local_228._16_8_;
  if ((local_228._16_8_ & 7) == 0 && (Alloc *)local_228._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288 = (Alloc *)(*(size_t *)local_228._16_8_ * 8 + 1);
    }
    else {
      *(int *)(local_228._16_8_ + 0x30) = *(int *)(local_228._16_8_ + 0x30) + 1;
    }
  }
  local_280 = local_210;
  local_278 = (element_type *)local_208._0_8_;
  if ((local_208._0_8_ & 7) == 0 && (element_type *)local_208._0_8_ != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_278 = (element_type *)((long)*(Library **)local_208._0_8_ * 8 + 1);
    }
    else {
      ppvVar1 = &(((HostRead<int> *)(local_208._0_8_ + 0x28))->read_).write_.shared_alloc_.
                 direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_;
  local_268 = (element_type *)local_2d8.shared_alloc_.alloc;
  if (((ulong)local_2d8.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2d8.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_268 = (element_type *)((long)(local_2d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      ppvVar1 = &(((HostRead<int> *)&(local_2d8.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  local_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.shared_alloc_.direct_ptr;
  local_1f8 = local_2b8;
  if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8 = (Alloc *)(local_2b8->size * 8 + 1);
    }
    else {
      local_2b8->use_count = local_2b8->use_count + 1;
    }
  }
  p_Stack_1f0 = local_240;
  local_1e8 = local_2a8;
  if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8 = (Alloc *)(local_2a8->size * 8 + 1);
    }
    else {
      local_2a8->use_count = local_2a8->use_count + 1;
    }
  }
  pvStack_1e0 = local_230;
  local_1d8 = local_298;
  if (((ulong)local_298 & 7) == 0 && local_298 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8 = (element_type *)((long)local_298->library_ * 8 + 1);
    }
    else {
      ppvVar1 = &(local_298->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
  local_1c8 = local_288;
  if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (Alloc *)(local_288->size * 8 + 1);
    }
    else {
      local_288->use_count = local_288->use_count + 1;
    }
  }
  local_2c0 = local_210;
  pvStack_1c0 = local_210;
  local_1b8 = local_278;
  if (((ulong)local_278 & 7) == 0 && local_278 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (element_type *)((long)local_278->library_ * 8 + 1);
    }
    else {
      ppvVar1 = &(local_278->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_;
  local_1a8 = local_268;
  if (((ulong)local_268 & 7) == 0 && local_268 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (element_type *)((long)local_268->library_ * 8 + 1);
    }
    else {
      ppvVar1 = &(local_268->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  _Stack_1a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.shared_alloc_.direct_ptr;
  if (0 < LVar8) {
    local_168._0_8_ = local_1f8;
    local_168._8_8_ = local_240;
    if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
      local_1f8->use_count = local_1f8->use_count + -1;
      local_168._0_8_ = local_1f8->size * 8 + 1;
    }
    local_1f8 = (Alloc *)0x0;
    p_Stack_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_168._16_8_ = local_1e8;
    local_168._24_8_ = local_230;
    if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
      local_1e8->use_count = local_1e8->use_count + -1;
      local_168._16_8_ = local_1e8->size * 8 + 1;
    }
    local_1e8 = (Alloc *)0x0;
    pvStack_1e0 = (void *)0x0;
    local_148 = local_1d8;
    local_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
    if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (element_type *)0x0) {
      ppvVar1 = &(local_1d8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      local_148 = (element_type *)((long)local_1d8->library_ * 8 + 1);
    }
    local_1d8 = (element_type *)0x0;
    p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_138 = local_1c8;
    local_130 = local_210;
    if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
      local_1c8->use_count = local_1c8->use_count + -1;
      local_138 = (Alloc *)(local_1c8->size * 8 + 1);
    }
    local_1c8 = (Alloc *)0x0;
    pvStack_1c0 = (void *)0x0;
    local_128 = local_1b8;
    local_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_;
    if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (element_type *)0x0) {
      ppvVar1 = &(local_1b8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      local_128 = (element_type *)((long)local_1b8->library_ * 8 + 1);
    }
    local_1b8 = (element_type *)0x0;
    _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118 = local_1a8;
    local_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.shared_alloc_.direct_ptr;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (element_type *)0x0) {
      ppvVar1 = &(local_1a8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      local_118 = (element_type *)((long)local_1a8->library_ * 8 + 1);
    }
    local_1a8 = (element_type *)0x0;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    entering_parallel = '\0';
    lVar12 = 0;
    do {
      iVar3 = *(int *)((long)local_230 + lVar12 * 4);
      lVar13 = (long)iVar3;
      iVar4 = *(int *)((long)local_230 + lVar12 * 4 + 4);
      if (iVar3 < iVar4) {
        iVar3 = *(int *)((long)&local_240->_vptr__Sp_counted_base + lVar12 * 4 + 4);
        iVar5 = *(int *)((long)&local_240->_vptr__Sp_counted_base + lVar12 * 4);
        do {
          uVar11 = 0xffffffff;
          if (iVar5 < iVar3) {
            lVar9 = 0;
            do {
              if (*(int *)((long)local_210 + lVar9 * 4 + (long)iVar5 * 4) ==
                  *(int *)((long)(_func_int ***)local_228._8_8_ + lVar13 * 4)) {
                uVar11 = *(undefined4 *)
                          ((long)(_func_int ***)local_208._8_8_ + lVar9 * 4 + (long)iVar5 * 4);
                break;
              }
              lVar9 = lVar9 + 1;
            } while (iVar3 - iVar5 != (int)lVar9);
          }
          *(undefined4 *)((long)(_func_int ***)local_2d8.shared_alloc_.direct_ptr + lVar13 * 4) =
               uVar11;
          lVar13 = lVar13 + 1;
        } while (lVar13 != iVar4);
      }
      lVar12 = lVar12 + 1;
    } while (LVar8 != (int)lVar12);
    local_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)local_168);
    this = (Omega_h *)local_190._M_pi;
  }
  other = local_2c8;
  form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)&local_1f8);
  Dist::Dist((Dist *)local_168,other);
  local_d8.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_d8.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Dist::set_roots2items((Dist *)local_168,&local_d8);
  pAVar6 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  local_258.shared_alloc_.alloc = local_2d8.shared_alloc_.alloc;
  if (((ulong)local_2d8.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2d8.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_258.shared_alloc_.alloc = (Alloc *)((long)(local_2d8.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      ppvVar1 = &(((HostRead<int> *)&(local_2d8.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  local_258.shared_alloc_.direct_ptr = local_2d8.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_188,&local_258);
  Dist::exch<int>((Dist *)this,(Read<int> *)local_168,(Int)&local_188);
  if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_188.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)&(local_188.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc(local_188.write_.shared_alloc_.alloc);
      operator_delete(local_188.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar6 = local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_258.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)&(local_258.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc(local_258.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  Dist::~Dist((Dist *)local_168);
  form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)&local_2b8);
  if (((ulong)local_2d8.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2d8.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)&(local_2d8.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc(local_2d8.shared_alloc_.alloc);
      operator_delete(local_2d8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
    piVar2 = &local_248->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_248);
      operator_delete(local_248,0x48);
    }
  }
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    piVar2 = &local_238->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_238);
      operator_delete(local_238,0x48);
    }
  }
  if ((local_228._0_8_ & 7) == 0 && (element_type *)local_228._0_8_ != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)(local_228._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_228._0_8_);
      operator_delete((void *)local_228._0_8_,0x48);
    }
  }
  if ((local_228._16_8_ & 7) == 0 && (Alloc *)local_228._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_228._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_228._16_8_);
      operator_delete((void *)local_228._16_8_,0x48);
    }
  }
  Dist::~Dist(&local_c0);
  pvVar10 = extraout_RDX;
  if ((local_208._0_8_ & 7) == 0 && (element_type *)local_208._0_8_ != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)(local_208._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_208._0_8_);
      operator_delete((void *)local_208._0_8_,0x48);
      pvVar10 = extraout_RDX_00;
    }
  }
  LVar14.write_.shared_alloc_.direct_ptr = pvVar10;
  LVar14.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar14.write_.shared_alloc_;
}

Assistant:

LOs form_new_conn(Dist new_ents2old_owners, Dist old_owners2new_uses) {
  auto nnew_ents = new_ents2old_owners.nitems();
  auto serv_ents2new_idxs = new_ents2old_owners.exch(LOs(nnew_ents, 0, 1), 1);
  auto old_owners2new_ents = new_ents2old_owners.invert();
  auto serv_ents2ranks = old_owners2new_ents.items2ranks();
  auto serv_uses2ranks = old_owners2new_uses.items2ranks();
  auto nserv_uses = old_owners2new_uses.nitems();
  auto old_owners2serv_uses = old_owners2new_uses.roots2items();
  auto old_owners2serv_ents = old_owners2new_ents.roots2items();
  auto nold_owners = old_owners2new_ents.nroots();
  Write<LO> serv_uses2new_idxs(nserv_uses);
  auto f = OMEGA_H_LAMBDA(LO old_owner) {
    auto ebegin = old_owners2serv_ents[old_owner];
    auto eend = old_owners2serv_ents[old_owner + 1];
    auto ubegin = old_owners2serv_uses[old_owner];
    auto uend = old_owners2serv_uses[old_owner + 1];
    for (auto serv_use = ubegin; serv_use < uend; ++serv_use) {
      auto rank = serv_uses2ranks[serv_use];
      LO idx = -1;
      for (auto e = ebegin; e < eend; ++e) {
        if (serv_ents2ranks[e] == rank) {
          idx = serv_ents2new_idxs[e];
          break;
        }
      }
      serv_uses2new_idxs[serv_use] = idx;
    }
  };
  parallel_for(nold_owners, f, "form_new_conn");
  auto serv_uses2new_uses = old_owners2new_uses;
  serv_uses2new_uses.set_roots2items(LOs());
  return serv_uses2new_uses.exch(LOs(serv_uses2new_idxs), 1);
}